

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiments.cpp
# Opt level: O0

void test(uint original_count,uint recovery_count,uint seed)

{
  int iVar1;
  uint uVar2;
  uint in_EDX;
  int in_ESI;
  int in_EDI;
  uint i_2;
  uint i_1;
  bool erasure [65536];
  ffe_t codeword [65536];
  uint i;
  ffe_t data [65536];
  uint n;
  uint m;
  ffe_t *in_stack_fffffffffffaffb8;
  undefined4 in_stack_fffffffffffaffc0;
  uint uVar3;
  undefined4 in_stack_fffffffffffaffc4;
  uint in_stack_fffffffffffaffc8;
  uint in_stack_fffffffffffaffcc;
  ffe_t *in_stack_fffffffffffaffd0;
  short asStack_40038 [32776];
  bool *in_stack_fffffffffffcffd8;
  uint in_stack_fffffffffffcffe4;
  uint in_stack_fffffffffffcffe8;
  uint in_stack_fffffffffffcffec;
  ffe_t *in_stack_fffffffffffcfff0;
  uint uStack_2002c;
  short asStack_20028 [65556];
  
  srand(in_EDX);
  memset(asStack_20028,0,0x20000);
  uVar3 = (uint)(2L << (0x3fU - (char)LZCOUNT((ulong)(in_ESI - 1)) & 0x3f));
  for (uStack_2002c = uVar3; uStack_2002c < uVar3 + in_EDI; uStack_2002c = uStack_2002c + 1) {
    iVar1 = rand();
    asStack_20028[uStack_2002c] = (short)iVar1;
  }
  memset(asStack_40038,0,0x20000);
  encodeH(in_stack_fffffffffffaffd0,in_stack_fffffffffffaffcc,in_stack_fffffffffffaffc8,
          (ffe_t *)CONCAT44(in_stack_fffffffffffaffc4,in_stack_fffffffffffaffc0),
          in_stack_fffffffffffaffb8);
  memcpy(asStack_40038,asStack_20028,0x20000);
  memset(&stack0xfffffffffffaffc8,0,0x10000);
  for (uVar2 = uVar3; uVar2 < uVar3 + in_ESI; uVar2 = uVar2 + 1) {
    (&stack0xfffffffffffaffc8)[uVar2] = 1;
  }
  decode(in_stack_fffffffffffcfff0,in_stack_fffffffffffcffec,in_stack_fffffffffffcffe8,
         in_stack_fffffffffffcffe4,in_stack_fffffffffffcffd8);
  uVar3 = 0;
  while( true ) {
    if (0xffff < uVar3) {
      printf(":D ");
      return;
    }
    if ((((&stack0xfffffffffffaffc8)[uVar3] & 1) != 0) &&
       (asStack_20028[uVar3] != asStack_40038[uVar3])) break;
    uVar3 = uVar3 + 1;
  }
  printf("Decoding Error with seed = %d!\n",(ulong)in_EDX);
  return;
}

Assistant:

void test(unsigned original_count, unsigned recovery_count, unsigned seed)
{
    unsigned m = 2UL << LastNonzeroBit64(recovery_count - 1);
    unsigned n = 2UL << LastNonzeroBit64(m + original_count - 1);

    srand(seed);

    //-----------Generating message----------

    // Message array
    ffe_t data[kFieldSize] = {0};

    // Filled with random numbers
    for (unsigned i = m; i < m + original_count; ++i)
        data[i] = (ffe_t)rand();


    //---------encoding----------

    ffe_t codeword[kFieldSize] = {};
    // First m codewords are for the parity data
    encodeH(data + m, m, original_count, data, codeword);
    //encodeL(data, k, codeword); // does not seem to work with any input?  what else needs to change?

    memcpy(codeword, data, sizeof(ffe_t) * kFieldSize);


    //--------erasure simulation---------

    // Array indicating erasures
    bool erasure[kFieldSize] = {
        false
    };

    // Tag the first "recovery_count" elements as erasures
    for (unsigned i = m; i < m + recovery_count; ++i)
        erasure[i] = true;

#if 0
    // permuting the erasure array
    for (unsigned i = m + original_count - 1; i > 0; --i)
    {
        unsigned pos = rand() % (i + 1);

        if (i != pos)
        {
            bool tmp = erasure[i];
            erasure[i] = erasure[pos];
            erasure[pos] = tmp;
        }
    }
#endif


    //---------main processing----------
    decode(codeword, m, original_count, n, erasure);

    // Check the correctness of the result
    for (unsigned i = 0; i < kFieldSize; ++i)
    {
        if (erasure[i])
        {
            if (data[i] != codeword[i])
            {
                printf("Decoding Error with seed = %d!\n", seed);
                LEO_DEBUG_BREAK;
                return;
            }
        }
    }

    printf(":D ");
}